

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  float ***pppfVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  iterator iVar10;
  BasicImageIO *pBVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  Image<float,_gimage::PixelTraits<float>_> *pIVar22;
  long lVar23;
  long i;
  ulong uVar24;
  ulong uVar25;
  float *pfVar26;
  int d;
  ulong uVar27;
  size_t __n;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  int depth;
  long local_270;
  uint local_264;
  ulong local_260;
  long local_258;
  long local_250;
  Image<float,_gimage::PixelTraits<float>_> *local_248;
  long local_240;
  long local_238;
  char *local_230;
  long local_228;
  long local_220;
  ulong local_218;
  long theight;
  long twidth;
  ImageIO *local_200;
  BasicImageIO *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long tborder;
  long local_1d0;
  long local_1c8;
  valarray<float> count;
  valarray<float> value;
  Image<float,_gimage::PixelTraits<float>_> timage;
  string tname;
  undefined4 uStack_144;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  local_264 = ds;
  local_258 = x;
  local_250 = y;
  local_248 = image;
  local_230 = name;
  local_200 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar6 = std::__cxx11::string::rfind((char)&s,0x3a);
  if (uVar6 != 0xffffffffffffffff) {
    iVar5 = std::__cxx11::string::compare((ulong)&s,uVar6,(char *)0x2);
    pcVar3 = local_230;
    if (iVar5 != 0) {
      local_1f8 = getBasicImageIO(local_200,local_230,true);
      std::__cxx11::string::string((string *)&s_1,pcVar3,(allocator *)&timage);
      uVar6 = std::__cxx11::string::rfind((char)&s_1,0x3a);
      if (uVar6 != 0xffffffffffffffff) {
        std::__cxx11::string::compare((ulong)&s_1,uVar6,(char *)0x2);
      }
      std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
      std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &list._M_t._M_impl.super__Rb_tree_header._M_header;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      anon_unknown_17::loadTiledHeader
                (local_1f8,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
      lVar7 = tborder;
      pIVar22 = local_248;
      lVar31 = (long)(int)local_264;
      local_270 = w;
      if (w < 1) {
        local_270 = (width + lVar31 + -1) / lVar31;
      }
      local_260 = h;
      if (h < 1) {
        local_260 = (height + lVar31 + -1) / lVar31;
      }
      local_1e8 = twidth + tborder * -2;
      local_228 = theight + tborder * -2;
      if (tborder == 0 && local_264 == 1) {
        lVar7 = 0;
        if (0 < local_258) {
          lVar7 = local_258;
        }
        lVar7 = lVar7 / local_1e8;
        lVar8 = (local_270 + local_258 + -1) / local_1e8;
        lVar9 = (long)(local_250 + local_260 + -1) / local_228;
        Image<float,_gimage::PixelTraits<float>_>::setSize
                  (local_248,local_270,local_260,(long)depth);
        Image<float,_gimage::PixelTraits<float>_>::clear(pIVar22);
        local_270 = local_270 + local_258;
        local_260 = local_260 + local_250;
        uVar6 = 0;
        lVar31 = 0;
        if (0 < local_250) {
          lVar31 = local_250;
        }
        local_1f0 = (long)(int)lVar7;
        local_1e0 = (long)(int)lVar9;
        lVar31 = (long)(int)(lVar31 / local_228);
        lVar7 = local_1e8;
        while (lVar31 <= local_1e0) {
          local_218 = local_250 - lVar31 * local_228;
          if ((long)local_218 < 1) {
            local_218 = uVar6;
          }
          lVar28 = lVar31 * local_228 + local_218;
          local_220 = local_260 - lVar28;
          lVar28 = lVar28 - local_250;
          lVar9 = local_1f0;
          local_240 = lVar31;
          while (lVar9 <= (int)lVar8) {
            uVar30 = local_258 - lVar9 * lVar7;
            if ((long)uVar30 < 1) {
              uVar30 = uVar6;
            }
            lVar31 = lVar9 * lVar7 + uVar30;
            lVar7 = local_270 - lVar31;
            if ((long)(twidth - uVar30) <= lVar7) {
              lVar7 = twidth - uVar30;
            }
            lVar12 = theight - local_218;
            if (local_220 < (long)(theight - local_218)) {
              lVar12 = local_220;
            }
            local_238 = lVar9;
            anon_unknown_17::getTileName(&tname,&prefix,(int)local_240,(int)lVar9,&suffix);
            Image<float,_gimage::PixelTraits<float>_>::Image(&timage,lVar7,lVar12,depth);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&list._M_t,&tname);
            if ((_Rb_tree_header *)iVar10._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_1f8->_vptr_BasicImageIO[8])
                        (local_1f8,&timage,tname._M_dataplus._M_p,1,uVar30,local_218,lVar7,lVar12);
              uVar30 = timage.width;
              if (timage.width < 1) {
                uVar30 = uVar6;
              }
              uVar19 = timage.height;
              if (timage.height < 1) {
                uVar19 = uVar6;
              }
              for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
                uVar24 = (ulong)(uint)depth;
                if (depth < 1) {
                  uVar24 = uVar6;
                }
                for (uVar25 = 0; uVar25 != uVar30; uVar25 = uVar25 + 1) {
                  pppfVar1 = local_248->img;
                  for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
                    pppfVar1[uVar27][lVar28 + uVar21][(lVar31 - local_258) + uVar25] =
                         timage.img[uVar27][uVar21][uVar25];
                  }
                }
              }
            }
            Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
            lVar7 = local_1e8;
            lVar9 = local_238 + 1;
          }
          lVar31 = local_240 + 1;
        }
      }
      else {
        local_1c8 = lVar31 * local_258;
        lVar8 = 0;
        if (0 < local_1c8 - tborder) {
          lVar8 = local_1c8 - tborder;
        }
        lVar8 = lVar8 / local_1e8;
        lVar12 = ((local_270 + local_258 + -1) * lVar31 + tborder) / local_1e8;
        lVar13 = (long)((local_250 + local_260 + -1) * lVar31 + tborder) / local_228;
        __n = local_260 * local_270;
        std::valarray<float>::valarray(&value,(long)depth * __n);
        std::valarray<float>::valarray(&count,__n);
        local_1d0 = lVar31 * local_250;
        lVar9 = local_270 + local_258;
        lVar20 = local_260 + local_250;
        lVar28 = local_1d0 - lVar7;
        if (local_1d0 - lVar7 < 1) {
          lVar28 = 0;
        }
        local_238 = local_270 * 4;
        pIVar22 = local_248;
        for (lVar7 = (long)(int)(lVar28 / local_228); lVar7 <= (int)lVar13; lVar7 = lVar7 + 1) {
          lVar14 = lVar7 * local_228;
          lVar15 = lVar14 - local_1d0;
          lVar28 = (long)(int)lVar8;
          while (lVar28 <= (int)lVar12) {
            lVar16 = lVar28 * local_1e8;
            lVar29 = tborder - lVar16;
            local_220 = local_1c8 + lVar29;
            if (local_220 < 1) {
              local_220 = 0;
            }
            lVar23 = tborder - lVar14;
            local_240 = local_1d0 + lVar23;
            if (local_240 < 1) {
              local_240 = 0;
            }
            lVar29 = (lVar29 + lVar9 * lVar31) - local_220;
            if (twidth - local_220 <= lVar29) {
              lVar29 = twidth - local_220;
            }
            lVar23 = (lVar23 + lVar20 * lVar31) - local_240;
            if (theight - local_240 <= lVar23) {
              lVar23 = theight - local_240;
            }
            local_1f0 = lVar28;
            anon_unknown_17::getTileName(&tname,&prefix,(int)lVar7,(int)lVar28,&suffix);
            Image<float,_gimage::PixelTraits<float>_>::Image(&timage,lVar29,lVar23,depth);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&list._M_t,&tname);
            lVar28 = local_220;
            if ((_Rb_tree_header *)iVar10._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_1f8->_vptr_BasicImageIO[8])
                        (local_1f8,&timage,tname._M_dataplus._M_p,1,local_220,local_240,lVar29,
                         lVar23);
              lVar16 = lVar16 - local_1c8;
              local_1e0 = lVar15 + local_240;
              auVar32 = extraout_XMM0;
              for (lVar29 = 0; lVar29 < timage.height; lVar29 = lVar29 + 1) {
                lVar23 = local_1e0 + lVar29;
                local_218 = local_240 + lVar29;
                auVar33._4_12_ = auVar32._4_12_;
                auVar33._0_4_ = (float)(long)local_218;
                auVar39 = auVar33;
                for (i = 0; i < timage.width; i = i + 1) {
                  bVar4 = Image<float,_gimage::PixelTraits<float>_>::isValid(&timage,i,lVar29);
                  auVar39 = extraout_XMM0_00;
                  if (bVar4) {
                    lVar17 = ((lVar16 + lVar28 + i) - tborder) / lVar31;
                    lVar18 = (lVar23 - tborder) / lVar31;
                    if (tborder < 1) {
                      uVar6 = (ulong)(uint)depth;
                      if (depth < 1) {
                        uVar6 = 0;
                      }
                      pfVar26 = (float *)(local_238 * lVar18 + lVar17 * 4 + (long)value._M_data);
                      for (uVar30 = 0; uVar6 != uVar30; uVar30 = uVar30 + 1) {
                        *pfVar26 = timage.img[uVar30][lVar29][i] + *pfVar26;
                        pfVar26 = pfVar26 + __n;
                      }
                      pfVar26 = count._M_data + lVar18 * local_270;
                      auVar39 = ZEXT416((uint)(pfVar26[lVar17] + 1.0));
                    }
                    else {
                      fVar41 = (float)tborder + (float)tborder;
                      fVar40 = (float)(local_220 + i) / fVar41;
                      auVar34._4_12_ = extraout_XMM0_00._4_12_;
                      auVar34._0_4_ = (float)(long)(theight - local_218);
                      fVar42 = (float)(twidth - (local_220 + i)) / fVar41;
                      if (fVar40 <= fVar42) {
                        fVar42 = fVar40;
                      }
                      uStack_144 = auVar32._4_4_;
                      auVar36._12_4_ = extraout_XMM0_00._12_4_;
                      auVar36._0_8_ = auVar34._0_8_;
                      auVar36._8_4_ = extraout_XMM0_00._4_4_;
                      auVar35._8_8_ = auVar36._8_8_;
                      auVar35._4_4_ = auVar33._0_4_;
                      auVar35._0_4_ = auVar34._0_4_;
                      auVar37._0_12_ = auVar35._0_12_;
                      auVar37._12_4_ = uStack_144;
                      auVar2._4_4_ = fVar41;
                      auVar2._0_4_ = fVar41;
                      auVar2._8_4_ = fVar41;
                      auVar2._12_4_ = fVar41;
                      auVar38 = divps(auVar37,auVar2);
                      if (auVar38._4_4_ <= auVar38._0_4_) {
                        auVar38._0_4_ = auVar38._4_4_;
                      }
                      if (1.0 <= fVar42) {
                        fVar42 = 1.0;
                      }
                      if (fVar42 <= 1e-06) {
                        fVar42 = 1e-06;
                      }
                      if (1.0 <= auVar38._0_4_) {
                        auVar38._0_4_ = 0x3f800000;
                      }
                      if (auVar38._0_4_ <= 1e-06) {
                        auVar38._0_4_ = 0x358637bd;
                      }
                      auVar39._4_12_ = auVar38._4_12_;
                      fVar42 = auVar38._0_4_ * fVar42;
                      uVar6 = (ulong)(uint)depth;
                      if (depth < 1) {
                        uVar6 = 0;
                      }
                      pfVar26 = (float *)(local_238 * lVar18 + lVar17 * 4 + (long)value._M_data);
                      for (uVar30 = 0; uVar6 != uVar30; uVar30 = uVar30 + 1) {
                        *pfVar26 = timage.img[uVar30][lVar29][i] * fVar42 + *pfVar26;
                        pfVar26 = pfVar26 + __n;
                      }
                      pfVar26 = count._M_data + lVar18 * local_270;
                      auVar39._0_4_ = fVar42 + pfVar26[lVar17];
                    }
                    pfVar26[lVar17] = auVar39._0_4_;
                  }
                }
                auVar32 = auVar39;
              }
            }
            Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
            pIVar22 = local_248;
            lVar28 = local_1f0 + 1;
          }
        }
        Image<float,_gimage::PixelTraits<float>_>::setSize(pIVar22,local_270,local_260,(long)depth);
        Image<float,_gimage::PixelTraits<float>_>::clear(pIVar22);
        lVar7 = 0;
        if (0 < local_270) {
          lVar7 = local_270;
        }
        uVar6 = local_260;
        if ((long)local_260 < 1) {
          uVar6 = 0;
        }
        lVar31 = 0;
        for (uVar30 = 0; uVar30 != uVar6; uVar30 = uVar30 + 1) {
          uVar19 = (ulong)(uint)depth;
          if (depth < 1) {
            uVar19 = 0;
          }
          lVar8 = lVar31;
          for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
            fVar42 = count._M_data[uVar30 * local_270 + lVar9];
            if (0.0 < fVar42) {
              pppfVar1 = local_248->img;
              pfVar26 = (float *)((long)value._M_data + lVar8);
              for (uVar21 = 0; uVar19 != uVar21; uVar21 = uVar21 + 1) {
                pppfVar1[uVar21][uVar30][lVar9] = *pfVar26 / fVar42;
                pfVar26 = pfVar26 + __n;
              }
            }
            lVar8 = lVar8 + 4;
          }
          lVar31 = lVar31 + local_238;
        }
        operator_delete(count._M_data);
        operator_delete(value._M_data);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&list._M_t);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&s_1);
      goto LAB_0012f42b;
    }
  }
  pBVar11 = getBasicImageIO(local_200,local_230,true);
  (*pBVar11->_vptr_BasicImageIO[8])
            (pBVar11,local_248,local_230,(ulong)local_264,local_258,local_250,w,h);
LAB_0012f42b:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void ImageIO::load(ImageFloat &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}